

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O2

bool __thiscall
CETestSuite::test_double
          (CETestSuite *this,double *value,double *expected,string *function,int *line)

{
  double __val;
  bool bVar1;
  CETestSuite *pCVar2;
  undefined1 local_199;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  double local_78;
  undefined8 uStack_70;
  string local_68;
  
  local_199 = 1;
  local_78 = ABS(this->tol_dbl_ * *expected);
  __val = *value;
  uStack_70 = 0;
  bVar1 = ABS(__val - *expected) <= local_78;
  if (bVar1) {
    std::__cxx11::to_string(&local_68,__val);
    std::operator+(&local_158,"DOUBLE value of ",&local_68);
    std::operator+(&local_138,&local_158," is within ");
    std::operator+(&local_118,&local_138,"tolerance of ");
    std::__cxx11::to_string(&local_178,local_78);
    std::operator+(&local_f8,&local_118,&local_178);
    std::operator+(&local_d8,&local_f8," of ");
    std::operator+(&local_b8,&local_d8,"expected value ");
    std::__cxx11::to_string(&local_198,*expected);
    std::operator+(&local_98,&local_b8,&local_198);
    pCVar2 = (CETestSuite *)&stack0xffffffffffffffb8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2,
                   &local_98,".");
    log_success(pCVar2,(string *)&stack0xffffffffffffffb8,function,line);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::to_string(&local_68,__val);
    std::operator+(&local_158,"DOUBLE value of ",&local_68);
    std::operator+(&local_138,&local_158," is NOT within ");
    std::operator+(&local_118,&local_138,"tolerance of ");
    std::__cxx11::to_string(&local_178,local_78);
    std::operator+(&local_f8,&local_118,&local_178);
    std::operator+(&local_d8,&local_f8," of ");
    std::operator+(&local_b8,&local_d8,"expected value ");
    std::__cxx11::to_string(&local_198,*expected);
    std::operator+(&local_98,&local_b8,&local_198);
    pCVar2 = (CETestSuite *)&stack0xffffffffffffffb8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2,
                   &local_98,".");
    log_failure(pCVar2,(string *)&stack0xffffffffffffffb8,function,line);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_199 = bVar1;
  (*this->_vptr_CETestSuite[0xf])(this,&local_199);
  return (bool)local_199;
}

Assistant:

bool CETestSuite::test_double(const double&      value, 
                              const double&      expected,
                              const std::string& function,
                              const int&         line)
{
    // Return status
    bool   ret_val      = true;
    double relative_tol = std::fabs(expected * tol_dbl_);

    // Values equal within tolerance
    if (std::fabs(value - expected) <= relative_tol) {
        log_success("DOUBLE value of "+std::to_string(value)+" is within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = true;
    } 
    // Values not within tolerance
    else {
        log_failure("DOUBLE value of "+std::to_string(value)+" is NOT within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = false;
    }

    update_pass(ret_val);
    return ret_val;
}